

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
anon_unknown.dwarf_301e5f::read_data_packed
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *data)

{
  bool bVar1;
  iterator_range<protozero::const_varint_iterator<unsigned_int>,_std::pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>_>
  xit;
  pbf_message<(anonymous_namespace)::ExampleMsg> message;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  message.super_pbf_reader.m_data = (data->_M_dataplus)._M_p;
  message.super_pbf_reader.m_end = message.super_pbf_reader.m_data + data->_M_string_length;
  message.super_pbf_reader.m_wire_type = unknown;
  message.super_pbf_reader.m_tag = 0;
  while( true ) {
    bVar1 = protozero::pbf_reader::next(&message.super_pbf_reader,1,length_delimited);
    if (!bVar1) break;
    protozero::pbf_reader::get_packed<protozero::const_varint_iterator<unsigned_int>>
              (&xit,&message.super_pbf_reader);
    std::__copy_move<false,false,std::forward_iterator_tag>::
    __copy_m<protozero::const_varint_iterator<unsigned_int>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (xit.
               super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
               .first,xit.
                      super_pair<protozero::const_varint_iterator<unsigned_int>,_protozero::const_varint_iterator<unsigned_int>_>
                      .second,
               (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
               __return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> read_data_packed(const std::string& data) {
    std::vector<uint32_t> values;

    protozero::pbf_message<ExampleMsg> message{data};
    while (message.next(ExampleMsg::repeated_uint32_x, protozero::pbf_wire_type::length_delimited)) {
        const auto xit = message.get_packed_uint32();
        std::copy(xit.cbegin(), xit.cend(), std::back_inserter(values));
    }

    return values;
}